

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::DragInt(char *label,int *v,float v_speed,int v_min,int v_max,char *display_format)

{
  bool bVar1;
  char *display_format_00;
  float v_f;
  float local_14;
  
  display_format_00 = "%.0f";
  if (display_format != (char *)0x0) {
    display_format_00 = display_format;
  }
  local_14 = (float)*v;
  bVar1 = DragFloat(label,&local_14,v_speed,(float)v_min,(float)v_max,display_format_00,1.0);
  *v = (int)local_14;
  return bVar1;
}

Assistant:

bool ImGui::DragInt(const char* label, int* v, float v_speed, int v_min, int v_max, const char* display_format)
{
    if (!display_format)
        display_format = "%.0f";
    float v_f = (float)*v;
    bool value_changed = DragFloat(label, &v_f, v_speed, (float)v_min, (float)v_max, display_format);
    *v = (int)v_f;
    return value_changed;
}